

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

Pla_Man_t * Pla_ManGenerate(int nInputs,int nOutputs,int nCubes,int fVerbose)

{
  int iVar1;
  Pla_Man_t *p;
  Vec_Bit_t *pVVar2;
  word *pwVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char Buffer [1000];
  
  uVar8 = 0;
  sprintf(Buffer,"%s_%d_%d_%d","rand",(ulong)(uint)nInputs,(ulong)(uint)nOutputs,(ulong)(uint)nCubes
         );
  p = Pla_ManAlloc(Buffer,nInputs,nOutputs,nCubes);
  pVVar2 = Pla_GenRandom(nInputs,nCubes,0);
  uVar5 = pVVar2->nSize;
  if (nInputs < 1) {
    nInputs = 0;
  }
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  iVar6 = 0;
  for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
    iVar1 = Vec_BitEntry(pVVar2,uVar8);
    if (iVar1 != 0) {
      pwVar3 = Pla_CubeIn(p,iVar6);
      bVar4 = 0;
      for (uVar7 = 0; nInputs != uVar7; uVar7 = uVar7 + 1) {
        pwVar3[uVar7 >> 5] =
             pwVar3[uVar7 >> 5] | (ulong)((uVar8 >> (uVar7 & 0x1f) & 1) != 0) + 1 << (bVar4 & 0x3e);
        bVar4 = bVar4 + 2;
      }
      iVar6 = iVar6 + 1;
    }
  }
  if (iVar6 != nCubes) {
    __assert_fail("Count == nCubes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaMan.c"
                  ,0xba,"Pla_Man_t *Pla_ManGenerate(int, int, int, int)");
  }
  Vec_BitFree(pVVar2);
  if (nOutputs < 2) {
    iVar6 = (p->vCubes).nSize;
    iVar1 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; iVar6 != iVar1; iVar1 = iVar1 + 1) {
      pwVar3 = Pla_CubeOut(p,iVar1);
      *(byte *)pwVar3 = (byte)*pwVar3 | 2;
    }
  }
  else {
    pVVar2 = Pla_GenRandom(nOutputs,nCubes,1);
    uVar8 = 0;
    uVar5 = pVVar2->nSize;
    if (pVVar2->nSize < 1) {
      uVar5 = uVar8;
    }
    iVar6 = 0;
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      iVar1 = Vec_BitEntry(pVVar2,uVar8);
      if (iVar1 != 0) {
        pwVar3 = Pla_CubeOut(p,iVar6);
        bVar4 = 0;
        for (uVar7 = 0; nOutputs != uVar7; uVar7 = uVar7 + 1) {
          pwVar3[uVar7 >> 5] =
               pwVar3[uVar7 >> 5] |
               (ulong)((uVar8 >> (uVar7 & 0x1f) & 1) != 0) + 1 << (bVar4 & 0x3e);
          bVar4 = bVar4 + 2;
        }
        iVar6 = iVar6 + 1;
      }
    }
    if (iVar6 != nCubes) {
      __assert_fail("Count == nCubes",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaMan.c"
                    ,199,"Pla_Man_t *Pla_ManGenerate(int, int, int, int)");
    }
    Vec_BitFree(pVVar2);
  }
  return p;
}

Assistant:

Pla_Man_t * Pla_ManGenerate( int nInputs, int nOutputs, int nCubes, int fVerbose )
{
    Pla_Man_t * p;
    Vec_Bit_t * vBits;
    int i, k, Count;
    word * pCube;
    char Buffer[1000];
    sprintf( Buffer, "%s_%d_%d_%d", "rand", nInputs, nOutputs, nCubes );
    p = Pla_ManAlloc( Buffer, nInputs, nOutputs, nCubes );
    // generate nCube random input minterms
    vBits = Pla_GenRandom( nInputs, nCubes, 0 );
    for ( i = Count = 0; i < Vec_BitSize(vBits); i++ )
        if ( Vec_BitEntry(vBits, i) )
        {
            pCube = Pla_CubeIn( p, Count++ );
            for ( k = 0; k < nInputs; k++ )
                Pla_CubeSetLit( pCube, k, ((i >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
        }
    assert( Count == nCubes );
    Vec_BitFree( vBits );
    // generate nCube random output minterms
    if ( nOutputs > 1 )
    {
        vBits = Pla_GenRandom( nOutputs, nCubes, 1 );
        for ( i = Count = 0; i < Vec_BitSize(vBits); i++ )
            if ( Vec_BitEntry(vBits, i) )
            {
                pCube = Pla_CubeOut( p, Count++ );
                for ( k = 0; k < nOutputs; k++ )
                    Pla_CubeSetLit( pCube, k, ((i >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
            }
        assert( Count == nCubes );
        Vec_BitFree( vBits );
    }
    else
    {
        Pla_ForEachCubeOut( p, pCube, i )
            Pla_CubeSetLit( pCube, 0, PLA_LIT_ONE );
    }
    return p;
}